

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.cpp
# Opt level: O1

unsafe_optional_ptr<const_Node> __thiscall
duckdb::ART::Lookup(ART *this,Node *node,ARTKey *key,idx_t depth)

{
  ulong uVar1;
  byte bVar2;
  optional_idx oVar3;
  reference<const_Node> ref;
  reference<const_duckdb::Node> local_30;
  idx_t local_28;
  
  local_30._M_data = node;
  local_28 = depth;
  do {
    uVar1 = ((local_30._M_data)->super_IndexPointer).data;
    if (uVar1 >> 0x38 == 0) {
      return (unsafe_optional_ptr<const_Node>)(Node *)0x0;
    }
    if ((long)uVar1 < 0) {
      return (unsafe_optional_ptr<const_Node>)local_30._M_data;
    }
    bVar2 = (byte)(uVar1 >> 0x38);
    if ((byte)((bVar2 & 0x7f) - 8) < 3) {
      return (unsafe_optional_ptr<const_Node>)local_30._M_data;
    }
    if (bVar2 < 0x82) {
      if (bVar2 == 2) {
        return (unsafe_optional_ptr<const_Node>)local_30._M_data;
      }
      if (bVar2 == 7) {
        return (unsafe_optional_ptr<const_Node>)local_30._M_data;
      }
    }
    else {
      if (bVar2 == 0x82) {
        return (unsafe_optional_ptr<const_Node>)local_30._M_data;
      }
      if (bVar2 == 0x87) {
        return (unsafe_optional_ptr<const_Node>)local_30._M_data;
      }
    }
    if ((bVar2 & 0x7f) == 1) {
      oVar3 = TraverseInternal<duckdb::Node_const>(this,&local_30,key,&local_28,false);
      if (oVar3.index != 0xffffffffffffffff) {
        return (unsafe_optional_ptr<const_Node>)(Node *)0x0;
      }
    }
    else {
      local_30._M_data =
           (Node *)GetChildInternal<duckdb::Node_const>(this,local_30._M_data,key->data[local_28]);
      if (local_30._M_data == (Node *)0x0) {
        return (unsafe_optional_ptr<const_Node>)(Node *)0x0;
      }
      local_28 = local_28 + 1;
    }
  } while( true );
}

Assistant:

const unsafe_optional_ptr<const Node> ART::Lookup(const Node &node, const ARTKey &key, idx_t depth) {
	reference<const Node> ref(node);
	while (ref.get().HasMetadata()) {

		// Return the leaf.
		if (ref.get().IsAnyLeaf() || ref.get().GetGateStatus() == GateStatus::GATE_SET) {
			return unsafe_optional_ptr<const Node>(ref.get());
		}

		// Traverse the prefix.
		if (ref.get().GetType() == NType::PREFIX) {
			auto pos = Prefix::Traverse(*this, ref, key, depth);
			if (pos.IsValid()) {
				// Prefix mismatch, return nullptr.
				return nullptr;
			}
			continue;
		}

		// Get the child node.
		D_ASSERT(depth < key.len);
		auto child = ref.get().GetChild(*this, key[depth]);

		// No child at the matching byte, return nullptr.
		if (!child) {
			return nullptr;
		}

		// Continue in the child.
		ref = *child;
		D_ASSERT(ref.get().HasMetadata());
		depth++;
	}

	return nullptr;
}